

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O1

string * __thiscall
ProblemAloha::SoftPrintBriefDescription_abi_cxx11_
          (string *__return_storage_ptr__,ProblemAloha *this)

{
  ostream *poVar1;
  IslandConfiguration extraout_EDX;
  IslandConfiguration extraout_EDX_00;
  IslandConfiguration extraout_EDX_01;
  IslandConfiguration conf;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Aloha_",6);
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x328))
            (&local_1c8,this,*(undefined4 *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  conf = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    conf = extraout_EDX_00;
  }
  if (*(int *)&(this->super_FactoredDecPOMDPDiscrete).field_0x704 == 0xb) {
    (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                           super_MultiAgentDecisionProcessDiscreteFactoredStates.
                           super_MultiAgentDecisionProcess + 0x10))(this);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    conf = extraout_EDX_01;
  }
  IslandConfigToString_abi_cxx11_
            (&local_1c8,
             (ProblemAloha *)(ulong)*(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x704,
             conf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_maxBL",6);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string ProblemAloha::SoftPrintBriefDescription() const
{
    stringstream ss;
    ss << "Aloha_" << SoftPrintVariation(GetVariation())
       << "_";
    if(GetIslandConfiguration()==InLine)
        ss << GetNrAgents();
    ss << IslandConfigToString(GetIslandConfiguration()) << "_maxBL"
       << GetMaxBacklog();
    return ss.str();
}